

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# modules.cpp
# Opt level: O0

int __thiscall
opengv::relative_pose::modules::fivept_nister::PollishCoefficientsFunctor::operator()
          (PollishCoefficientsFunctor *this,VectorXd *x,VectorXd *fvec)

{
  double dVar1;
  double dVar2;
  double dVar3;
  Scalar *pSVar4;
  CoeffReturnType pdVar5;
  __type _Var6;
  Matrix<double,_20,_1,_0,_20,_1> monomials;
  undefined4 in_stack_fffffffffffffde0;
  int in_stack_fffffffffffffde4;
  MatrixBase<Eigen::Matrix<double,_10,_20,_0,_10,_20>_> *in_stack_fffffffffffffde8;
  
  Eigen::Matrix<double,_20,_1,_0,_20,_1>::Matrix((Matrix<double,_20,_1,_0,_20,_1> *)0xead5a4);
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6 * dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1 * _Var6;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6 * dVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6 * dVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar2 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar3 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1 * dVar2 * dVar3;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar2 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1 * dVar2;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1 * _Var6;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar2 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1 * dVar2;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1 * _Var6;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar2 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1 * dVar2;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6;
  Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
            ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)in_stack_fffffffffffffde8
             ,CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  _Var6 = std::pow<double,int>((double)in_stack_fffffffffffffde8,in_stack_fffffffffffffde4);
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = _Var6;
  pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  dVar1 = *pdVar5;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = dVar1;
  pSVar4 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>,_1> *)
                      in_stack_fffffffffffffde8,
                      CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  *pSVar4 = 1.0;
  Eigen::MatrixBase<Eigen::Matrix<double,10,20,0,10,20>>::operator*
            (in_stack_fffffffffffffde8,
             (MatrixBase<Eigen::Matrix<double,_20,_1,_0,_20,_1>_> *)
             CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  Eigen::Matrix<double,-1,1,0,-1,1>::operator=
            ((Matrix<double,__1,_1,_0,__1,_1> *)in_stack_fffffffffffffde8,
             (DenseBase<Eigen::Product<Eigen::Matrix<double,_10,_20,_0,_10,_20>,_Eigen::Matrix<double,_20,_1,_0,_20,_1>,_0>_>
              *)CONCAT44(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0));
  return 0;
}

Assistant:

int operator()(const VectorXd &x, VectorXd &fvec) const
  {
    assert( x.size() == 3 );
    assert( (unsigned int) fvec.size() == 10);

    //create the monomials vector
    Eigen::Matrix<double,20,1> monomials;
    monomials[0] = pow(x[0],3);
    monomials[1] = pow(x[1],3);
    monomials[2] = pow(x[0],2)*x[1];
    monomials[3] = x[0]*pow(x[1],2);
    monomials[4] = pow(x[0],2)*x[2];
    monomials[5] = pow(x[0],2);
    monomials[6] = pow(x[1],2)*x[2];
    monomials[7] = pow(x[1],2);
    monomials[8] = x[0]*x[1]*x[2];
    monomials[9] = x[0]*x[1];
    monomials[10] = x[0]*pow(x[2],2);
    monomials[11] = x[0]*x[2];
    monomials[12] = x[0];
    monomials[13] = x[1]*pow(x[2],2);
    monomials[14] = x[1]*x[2];
    monomials[15] = x[1];
    monomials[16] = pow(x[2],3);
    monomials[17] = pow(x[2],2);
    monomials[18] = x[2];
    monomials[19] = 1.0;

    fvec = _A*monomials;

    return 0;
  }